

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_int8.h
# Opt level: O3

void ncnn::conv_im2col_sgemm_int8_dequant_sse
               (Mat *bottom_blob,Mat *top_blob,Mat *_kernel,int kernel_w,int kernel_h,int stride_w,
               int stride_h,Mat *_bias,vector<float,_std::allocator<float>_> *scale_dequant,
               Option *opt)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  size_t sVar5;
  size_t sVar6;
  pointer pfVar7;
  undefined1 auVar8 [14];
  undefined1 auVar9 [14];
  undefined1 auVar10 [14];
  undefined1 auVar11 [14];
  undefined1 auVar12 [14];
  undefined1 auVar13 [14];
  undefined1 auVar14 [14];
  undefined1 auVar15 [14];
  undefined1 auVar16 [14];
  undefined1 auVar17 [14];
  undefined1 auVar18 [14];
  undefined1 auVar19 [14];
  undefined1 auVar20 [14];
  undefined1 auVar21 [14];
  undefined1 auVar22 [12];
  undefined1 auVar23 [12];
  undefined1 auVar24 [12];
  undefined1 auVar25 [14];
  undefined1 auVar26 [14];
  unkbyte10 Var27;
  uint uVar28;
  int iVar29;
  ulong uVar30;
  void *__ptr;
  void *pvVar31;
  float *pfVar32;
  uint uVar33;
  int iVar34;
  int iVar35;
  uint uVar36;
  uint uVar37;
  long lVar38;
  void *pvVar39;
  float *pfVar40;
  int iVar41;
  ulong uVar42;
  void *pvVar43;
  char *pcVar44;
  int iVar45;
  float *pfVar46;
  undefined1 *puVar47;
  int iVar48;
  void *pvVar49;
  int iVar50;
  uint uVar51;
  float *pfVar52;
  long lVar53;
  long lVar54;
  undefined1 *puVar55;
  void *pvVar56;
  ulong *puVar57;
  long lVar58;
  void *pvVar59;
  ulong uVar60;
  int p;
  int iVar61;
  ulong uVar62;
  uint uVar63;
  size_t totalsize;
  void *pvVar64;
  char *pcVar65;
  char *pcVar66;
  char *ret;
  int n_1;
  int iVar67;
  long lVar68;
  short sVar69;
  short sVar77;
  short sVar78;
  short sVar79;
  undefined1 auVar70 [12];
  undefined1 auVar72 [16];
  undefined1 auVar71 [12];
  undefined1 auVar74 [16];
  short sVar80;
  float fVar81;
  short sVar85;
  short sVar86;
  undefined1 auVar82 [16];
  short sVar84;
  undefined1 auVar83 [16];
  short sVar87;
  short sVar88;
  short sVar89;
  short sVar90;
  short sVar93;
  float fVar91;
  short sVar94;
  short sVar95;
  undefined1 auVar92 [16];
  short sVar97;
  undefined1 auVar96 [16];
  float fVar98;
  short sVar99;
  float fVar100;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  short sVar111;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  void *ptr_1;
  void *ptr;
  int sum3 [4];
  int sum2 [4];
  int sum1 [4];
  void *local_188;
  undefined1 local_138 [16];
  ulong local_120;
  Mat *local_118;
  int *local_110;
  Allocator *local_108;
  ulong local_100;
  ulong local_f8;
  float local_f0;
  float local_ec;
  undefined1 local_e8 [16];
  long local_d8;
  undefined4 local_d0;
  Allocator *local_c8;
  undefined4 local_c0;
  int local_bc;
  uint local_b8;
  int local_b4;
  ulong local_b0;
  int *local_a8;
  Mat *local_a0;
  ulong local_98;
  ulong local_90;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  Allocator *local_58;
  long local_50;
  void *local_48;
  pointer local_40;
  void *local_38;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar73 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  
  uVar37 = bottom_blob->w;
  uVar51 = bottom_blob->c;
  iVar41 = top_blob->w;
  iVar29 = top_blob->h;
  uVar33 = uVar51 * kernel_h * kernel_w;
  uVar28 = iVar29 * iVar41;
  local_120 = (ulong)top_blob->c;
  local_108 = opt->workspace_allocator;
  local_118 = _kernel;
  local_a0 = top_blob;
  if (uVar28 * uVar33 == 0) {
    local_110 = (int *)0x0;
    __ptr = (void *)0x0;
  }
  else {
    uVar30 = (long)(int)(uVar28 * uVar33) + 3U & 0xfffffffffffffffc;
    if (local_108 == (Allocator *)0x0) {
      auVar105._8_8_ = 0;
      auVar105._0_8_ = local_e8._0_8_;
      local_e8 = auVar105 << 0x40;
      iVar35 = posix_memalign((void **)local_e8,0x10,uVar30 + 4);
      __ptr = (void *)0x0;
      if (iVar35 == 0) {
        __ptr = (void *)local_e8._0_8_;
      }
    }
    else {
      __ptr = (void *)(**(code **)(*(long *)local_108 + 0x10))();
    }
    local_110 = (int *)((long)__ptr + uVar30);
    *(undefined4 *)((long)__ptr + uVar30) = 1;
  }
  if (0 < iVar29) {
    local_f8 = (ulong)(stride_h * uVar37);
    lVar54 = 0;
    iVar50 = 0;
    iVar35 = 0;
    do {
      if (0 < iVar41) {
        iVar34 = 0;
        lVar53 = lVar54;
        do {
          if (0 < (int)uVar51) {
            uVar30 = 0;
            do {
              if (0 < kernel_h) {
                sVar5 = bottom_blob->cstep;
                sVar6 = bottom_blob->elemsize;
                pvVar59 = bottom_blob->data;
                iVar48 = 0;
                lVar58 = lVar53;
                do {
                  if (0 < kernel_w) {
                    uVar42 = 0;
                    do {
                      *(undefined1 *)((long)__ptr + uVar42 + (long)iVar50) =
                           *(undefined1 *)
                            ((long)pvVar59 +
                            (long)((int)lVar58 + (int)uVar42) + sVar5 * uVar30 * sVar6);
                      uVar42 = uVar42 + 1;
                    } while ((uint)kernel_w != uVar42);
                    iVar50 = iVar50 + (int)uVar42;
                  }
                  iVar48 = iVar48 + 1;
                  lVar58 = lVar58 + (ulong)uVar37;
                } while (iVar48 != kernel_h);
              }
              uVar30 = uVar30 + 1;
            } while (uVar30 != uVar51);
          }
          iVar34 = iVar34 + 1;
          lVar53 = lVar53 + (ulong)(uint)stride_w;
        } while (iVar34 != iVar41);
      }
      iVar35 = iVar35 + 1;
      lVar54 = lVar54 + local_f8;
    } while (iVar35 != iVar29);
  }
  local_bc = kernel_h * kernel_w * 4;
  uVar37 = uVar28 + 3;
  if (-1 < (int)uVar28) {
    uVar37 = uVar28;
  }
  local_b4 = uVar28 + ((int)uVar37 >> 2) * -3;
  local_c8 = opt->workspace_allocator;
  local_e8 = (undefined1  [16])0x0;
  local_d8 = 1;
  local_d0 = 1;
  local_c0 = 3;
  iVar41 = local_bc * uVar51;
  uVar30 = (long)iVar41 + 0xfU & 0xfffffffffffffff0;
  uVar42 = (long)local_b4 * uVar30;
  local_b8 = uVar51;
  local_b0 = uVar30;
  if (uVar42 != 0) {
    if (local_c8 == (Allocator *)0x0) {
      auVar112._8_8_ = 0;
      auVar112._0_8_ = local_138._8_8_;
      local_138 = auVar112 << 0x40;
      iVar29 = posix_memalign((void **)local_138,0x10,uVar42 | 4);
      local_e8._0_8_ = (void *)0x0;
      if (iVar29 == 0) {
        local_e8._0_8_ = local_138._0_8_;
      }
    }
    else {
      local_e8._0_8_ = (**(code **)(*(long *)local_c8 + 0x10))();
    }
    local_e8._8_8_ = (void *)(local_e8._0_8_ + uVar42);
    *(undefined4 *)(local_e8._0_8_ + uVar42) = 1;
  }
  lVar54 = (long)(int)uVar33;
  if (0 < (int)uVar28 >> 2) {
    lVar58 = lVar54 * 4;
    lVar53 = (long)__ptr + lVar54;
    pvVar56 = (void *)(lVar54 * 3 + (long)__ptr);
    pvVar59 = (void *)((long)__ptr + lVar54 * 2);
    uVar42 = 0;
    pvVar64 = __ptr;
    do {
      puVar47 = (undefined1 *)(local_b0 * uVar42 * local_d8 + local_e8._0_8_);
      if ((int)uVar33 < 2) {
        pvVar43 = (void *)(uVar42 * 4 * lVar54 + (long)__ptr);
        pvVar49 = (void *)((uVar42 * 4 + 1) * lVar54 + (long)__ptr);
        pvVar39 = (void *)((uVar42 * 4 + 2) * lVar54 + (long)__ptr);
        pvVar31 = (void *)((uVar42 * 4 + 3) * lVar54 + (long)__ptr);
        uVar37 = 0;
      }
      else {
        lVar68 = 0;
        do {
          puVar55 = puVar47;
          puVar47 = (undefined1 *)(local_e8._0_8_ + lVar68 * 4 + local_b0 * local_d8 * uVar42);
          *puVar47 = *(undefined1 *)((long)pvVar64 + lVar68);
          puVar47[1] = *(undefined1 *)((long)pvVar64 + lVar68 + 1);
          puVar47[2] = *(undefined1 *)(lVar53 + lVar68);
          puVar47[3] = *(undefined1 *)(lVar53 + 1 + lVar68);
          puVar47[4] = *(undefined1 *)((long)pvVar59 + lVar68);
          puVar47[5] = *(undefined1 *)((long)pvVar59 + lVar68 + 1);
          puVar47[6] = *(undefined1 *)((long)pvVar56 + lVar68);
          puVar47[7] = *(undefined1 *)((long)pvVar56 + lVar68 + 1);
          lVar38 = lVar68 + 2;
          iVar29 = (int)lVar68;
          lVar68 = lVar38;
          puVar47 = puVar47 + 8;
        } while (iVar29 + 3 < (int)uVar33);
        puVar47 = puVar55 + 8;
        pvVar43 = (void *)(lVar38 + (long)pvVar64);
        pvVar49 = (void *)(lVar53 + lVar38);
        pvVar31 = (void *)((long)pvVar56 + lVar38);
        pvVar39 = (void *)(lVar38 + (long)pvVar59);
        uVar37 = uVar33 & 0xfffffffe;
      }
      if ((int)uVar37 < (int)uVar33) {
        lVar68 = 0;
        do {
          puVar47[lVar68 * 4] = *(undefined1 *)((long)pvVar43 + lVar68);
          puVar47[lVar68 * 4 + 1] = *(undefined1 *)((long)pvVar49 + lVar68);
          puVar47[lVar68 * 4 + 2] = *(undefined1 *)((long)pvVar39 + lVar68);
          puVar47[lVar68 * 4 + 3] = *(undefined1 *)((long)pvVar31 + lVar68);
          lVar68 = lVar68 + 1;
        } while (uVar33 - uVar37 != (int)lVar68);
      }
      uVar42 = uVar42 + 1;
      pvVar64 = (void *)((long)pvVar64 + lVar58);
      lVar53 = lVar53 + lVar58;
      pvVar56 = (void *)((long)pvVar56 + lVar58);
      pvVar59 = (void *)((long)pvVar59 + lVar58);
    } while (uVar42 != (uint)((int)uVar28 >> 2));
  }
  if ((uVar28 & 0xfffffffc) != uVar28) {
    lVar53 = (long)(int)(uVar28 & 0xfffffffc);
    do {
      puVar47 = (undefined1 *)(lVar53 * lVar54 + (long)__ptr);
      uVar37 = (uint)lVar53;
      uVar63 = uVar37 + 3;
      if (-1 < (int)uVar37) {
        uVar63 = uVar37;
      }
      puVar55 = (undefined1 *)
                ((long)(int)(((int)uVar63 >> 2) + (uVar37 - (uVar63 & 0xfffffffc))) * local_b0 *
                 local_d8 + local_e8._0_8_);
      if ((int)uVar33 < 2) {
        uVar37 = 0;
      }
      else {
        iVar29 = 1;
        do {
          *puVar55 = *puVar47;
          puVar55[1] = puVar47[1];
          puVar55 = puVar55 + 2;
          puVar47 = puVar47 + 2;
          iVar29 = iVar29 + 2;
          uVar37 = uVar33 & 0xfffffffe;
        } while (iVar29 < (int)uVar33);
      }
      if ((int)uVar37 < (int)uVar33) {
        lVar58 = 0;
        do {
          puVar55[lVar58] = puVar47[lVar58];
          lVar58 = lVar58 + 1;
        } while (uVar33 - uVar37 != (int)lVar58);
      }
      lVar53 = lVar53 + 1;
    } while (lVar53 < (int)uVar28);
  }
  uVar37 = (uint)local_120;
  uVar63 = uVar37 + 3;
  if (-1 < (int)uVar37) {
    uVar63 = uVar37;
  }
  uVar36 = uVar37 + 3;
  if (-1 < (int)uVar37) {
    uVar36 = uVar37;
  }
  local_58 = opt->workspace_allocator;
  uVar42 = (long)(int)((uVar37 - (uVar36 & 0xfffffffc)) + ((int)uVar63 >> 2)) * uVar30;
  if (uVar42 == 0) {
    local_a8 = (int *)0x0;
    local_188 = (void *)0x0;
  }
  else {
    if (local_58 == (Allocator *)0x0) {
      local_188 = (void *)0x0;
      auVar92._8_8_ = 0;
      auVar92._0_8_ = local_138._8_8_;
      local_138 = auVar92 << 0x40;
      iVar29 = posix_memalign((void **)local_138,0x10,uVar42 | 4);
      if (iVar29 == 0) {
        local_188 = (void *)local_138._0_8_;
      }
    }
    else {
      local_188 = (void *)(**(code **)(*(long *)local_58 + 0x10))();
    }
    local_a8 = (int *)((long)local_188 + uVar42);
    *(undefined4 *)((long)local_188 + uVar42) = 1;
  }
  iVar29 = (int)local_120;
  uVar37 = iVar29 >> 2;
  local_98 = local_120 & 0xfffffffffffffffc;
  local_90 = (ulong)uVar37;
  if (0 < (int)uVar37) {
    iVar50 = uVar51 * kernel_h * kernel_w;
    iVar35 = iVar50 * 3;
    iVar50 = iVar50 * 2;
    iVar34 = 0;
    uVar42 = 0;
    pvVar59 = local_188;
    uVar51 = uVar33;
    do {
      puVar47 = (undefined1 *)(uVar30 * uVar42 + (long)local_188);
      if ((int)uVar33 < 2) {
        iVar48 = (int)uVar42;
        lVar53 = (long)&local_118->data + (long)(int)((iVar48 * 4 + 3) * uVar33);
        lVar54 = (long)&local_118->data + (long)(int)((iVar48 * 4 + 2) * uVar33);
        lVar58 = (long)&local_118->data + (long)(int)((iVar48 * 4 + 1) * uVar33);
        lVar68 = (long)&local_118->data + (long)(int)(iVar48 * 4 * uVar33);
        uVar63 = 0;
      }
      else {
        lVar54 = 0;
        do {
          puVar55 = puVar47;
          puVar47 = (undefined1 *)((long)pvVar59 + lVar54 * 4);
          *puVar47 = *(undefined1 *)((long)&local_118->data + lVar54 + iVar34);
          puVar47[1] = *(undefined1 *)((long)&local_118->data + lVar54 + (long)iVar34 + 1);
          puVar47[2] = *(undefined1 *)((long)&local_118->data + lVar54 + (int)uVar51);
          puVar47[3] = *(undefined1 *)((long)&local_118->data + lVar54 + (long)(int)uVar51 + 1);
          puVar47[4] = *(undefined1 *)((long)&local_118->data + lVar54 + iVar50);
          puVar47[5] = *(undefined1 *)((long)&local_118->data + lVar54 + (long)iVar50 + 1);
          puVar47[6] = *(undefined1 *)((long)&local_118->data + lVar54 + iVar35);
          puVar47[7] = *(undefined1 *)((long)&local_118->data + lVar54 + (long)iVar35 + 1);
          lVar68 = lVar54 + 2;
          iVar48 = (int)lVar54;
          lVar54 = lVar68;
          puVar47 = puVar47 + 8;
        } while (iVar48 + 3 < (int)uVar33);
        puVar47 = puVar55 + 8;
        lVar53 = (long)&local_118->data + lVar68 + iVar35;
        lVar54 = (long)&local_118->data + lVar68 + iVar50;
        lVar58 = (long)&local_118->data + lVar68 + (int)uVar51;
        lVar68 = (long)&local_118->data + lVar68 + iVar34;
        uVar63 = uVar33 & 0xfffffffe;
      }
      if ((int)uVar63 < (int)uVar33) {
        lVar38 = 0;
        do {
          puVar47[lVar38 * 4] = *(undefined1 *)(lVar68 + lVar38);
          puVar47[lVar38 * 4 + 1] = *(undefined1 *)(lVar58 + lVar38);
          puVar47[lVar38 * 4 + 2] = *(undefined1 *)(lVar54 + lVar38);
          puVar47[lVar38 * 4 + 3] = *(undefined1 *)(lVar53 + lVar38);
          lVar38 = lVar38 + 1;
        } while (uVar33 - uVar63 != (int)lVar38);
      }
      uVar42 = uVar42 + 1;
      pvVar59 = (void *)((long)pvVar59 + uVar30);
      iVar35 = iVar35 + iVar41;
      iVar50 = iVar50 + iVar41;
      uVar51 = uVar51 + iVar41;
      iVar34 = iVar34 + iVar41;
    } while (uVar42 != local_90);
  }
  iVar41 = (int)local_98;
  if (iVar41 != iVar29) {
    uVar42 = local_98;
    do {
      uVar51 = (uint)uVar42;
      uVar63 = uVar51 + 3;
      if (-1 < (int)uVar51) {
        uVar63 = uVar51;
      }
      puVar47 = (undefined1 *)
                ((long)(int)(((int)uVar63 >> 2) + (uVar51 - (uVar63 & 0xfffffffc))) * uVar30 +
                (long)local_188);
      puVar55 = (undefined1 *)((long)&local_118->data + (long)(int)(uVar33 * uVar51));
      if ((int)uVar33 < 2) {
        uVar51 = 0;
      }
      else {
        iVar35 = 1;
        do {
          *puVar47 = *puVar55;
          puVar47[1] = puVar55[1];
          puVar47 = puVar47 + 2;
          puVar55 = puVar55 + 2;
          iVar35 = iVar35 + 2;
          uVar51 = uVar33 & 0xfffffffe;
        } while (iVar35 < (int)uVar33);
      }
      if ((int)uVar51 < (int)uVar33) {
        lVar54 = 0;
        do {
          puVar47[lVar54] = puVar55[lVar54];
          lVar54 = lVar54 + 1;
        } while (uVar33 - uVar51 != (int)lVar54);
      }
      uVar42 = uVar42 + 1;
    } while ((long)uVar42 < (long)local_120);
  }
  if (0 < (int)uVar37) {
    local_40 = (scale_dequant->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
    local_48 = local_a0->data;
    local_50 = local_a0->cstep * local_a0->elemsize;
    local_38 = (void *)local_e8._0_8_;
    uVar42 = 0;
    do {
      local_100 = uVar42;
      uVar42 = local_100 * 4;
      if (_bias == (Mat *)0x0) {
        fVar91 = 0.0;
        fVar81 = 0.0;
        fVar98 = 0.0;
        fVar100 = 0.0;
      }
      else {
        fVar81 = *(float *)(&_bias->data + local_100 * 2);
        fVar98 = *(float *)((long)&_bias->data + local_100 * 0x10 + 4);
        fVar91 = *(float *)(&_bias->refcount + local_100 * 2);
        fVar100 = *(float *)((long)&_bias->refcount + local_100 * 0x10 + 4);
      }
      pfVar46 = (float *)(local_50 * uVar42 + (long)local_48);
      pfVar32 = (float *)(local_50 * (uVar42 | 1) + (long)local_48);
      pfVar40 = (float *)(local_50 * (uVar42 | 2) + (long)local_48);
      pfVar52 = (float *)(local_50 * (uVar42 | 3) + (long)local_48);
      uVar62 = 0;
      fVar1 = local_40[local_100 * 4];
      fVar2 = local_40[uVar42 | 1];
      fVar3 = local_40[uVar42 | 2];
      fVar4 = local_40[uVar42 | 3];
      if (3 < (int)uVar28) {
        pcVar44 = (char *)(uVar30 * local_100 + (long)local_188);
        local_118 = (Mat *)CONCAT44(local_118._4_4_,fVar81);
        local_f8 = CONCAT44(local_f8._4_4_,fVar100);
        uVar42 = 0;
        do {
          puVar57 = (ulong *)((uVar42 >> 2) * local_b0 * local_d8 + local_e8._0_8_);
          local_138 = (undefined1  [16])0x0;
          local_68 = (undefined1  [16])0x0;
          local_78 = (undefined1  [16])0x0;
          local_88 = (undefined1  [16])0x0;
          pcVar65 = pcVar44;
          uVar37 = 0;
          if (1 < (int)uVar33) {
            local_68._0_4_ = 0;
            local_68._4_4_ = 0;
            local_68._8_4_ = 0;
            local_68._12_4_ = 0;
            local_78._0_4_ = 0;
            local_78._4_4_ = 0;
            local_78._8_4_ = 0;
            local_78._12_4_ = 0;
            iVar35 = 1;
            local_88._0_4_ = 0;
            local_88._4_4_ = 0;
            local_88._8_4_ = 0;
            local_88._12_4_ = 0;
            auVar105 = (undefined1  [16])0x0;
            do {
              iVar34 = (int)pcVar65[1];
              iVar50 = (int)*pcVar65;
              auVar116._4_4_ = iVar50;
              auVar116._0_4_ = iVar50;
              auVar116._8_4_ = iVar50;
              auVar116._12_4_ = iVar50;
              auVar82._8_8_ = 0;
              auVar82._0_8_ = *puVar57;
              auVar112 = psllw(auVar82,8);
              auVar113 = psraw(auVar112,8);
              auVar112 = pshuflw(ZEXT416((uint)(int)pcVar65[2]),ZEXT416((uint)(int)pcVar65[2]),0);
              sVar111 = auVar113._0_2_;
              sVar69 = auVar112._0_2_ * sVar111;
              sVar80 = auVar113._2_2_;
              sVar77 = auVar112._2_2_ * sVar80;
              sVar84 = auVar113._4_2_;
              sVar78 = auVar112._4_2_ * sVar84;
              sVar85 = auVar113._6_2_;
              sVar79 = auVar112._6_2_ * sVar85;
              auVar112 = pshuflw(ZEXT416((uint)(int)pcVar65[4]),ZEXT416((uint)(int)pcVar65[4]),0);
              sVar87 = auVar112._0_2_ * sVar111;
              sVar88 = auVar112._2_2_ * sVar80;
              sVar89 = auVar112._4_2_ * sVar84;
              sVar90 = auVar112._6_2_ * sVar85;
              auVar92 = pshuflw(ZEXT416((uint)(int)pcVar65[6]),ZEXT416((uint)(int)pcVar65[6]),0);
              sVar93 = auVar92._2_2_ * sVar80;
              sVar94 = auVar92._4_2_ * sVar84;
              sVar95 = auVar92._6_2_ * sVar85;
              auVar8._10_2_ = 0;
              auVar8._0_10_ = auVar113._0_10_;
              auVar8._12_2_ = sVar85;
              auVar12._8_2_ = sVar84;
              auVar12._0_8_ = auVar113._0_8_;
              auVar12._10_4_ = auVar8._10_4_;
              auVar20._6_8_ = 0;
              auVar20._0_6_ = auVar12._8_6_;
              auVar16._4_2_ = sVar80;
              auVar16._0_4_ = auVar113._0_4_;
              auVar16._6_8_ = SUB148(auVar20 << 0x40,6);
              auVar114._0_4_ = auVar113._0_4_ & 0xffff;
              auVar114._4_10_ = auVar16._4_10_;
              auVar114._14_2_ = 0;
              auVar115 = pmaddwd(auVar114,auVar116);
              auVar112 = psraw(auVar82,8);
              auVar117 = pshuflw(ZEXT416((uint)(int)pcVar65[3]),ZEXT416((uint)(int)pcVar65[3]),0);
              sVar80 = auVar112._0_2_;
              sVar84 = auVar112._2_2_;
              sVar85 = auVar112._4_2_;
              sVar86 = auVar112._6_2_;
              auVar96 = pshuflw(ZEXT416((uint)(int)pcVar65[5]),ZEXT416((uint)(int)pcVar65[5]),0);
              sVar97 = auVar96._6_2_ * sVar86;
              auVar82 = pshuflw(ZEXT416((uint)(int)pcVar65[7]),ZEXT416((uint)(int)pcVar65[7]),0);
              sVar99 = auVar82._6_2_ * sVar86;
              auVar9._10_2_ = 0;
              auVar9._0_10_ = auVar112._0_10_;
              auVar9._12_2_ = sVar86;
              auVar13._8_2_ = sVar85;
              auVar13._0_8_ = auVar112._0_8_;
              auVar13._10_4_ = auVar9._10_4_;
              auVar21._6_8_ = 0;
              auVar21._0_6_ = auVar13._8_6_;
              auVar17._4_2_ = sVar84;
              auVar17._0_4_ = auVar112._0_4_;
              auVar17._6_8_ = SUB148(auVar21 << 0x40,6);
              auVar83._0_4_ = auVar112._0_4_ & 0xffff;
              auVar83._4_10_ = auVar17._4_10_;
              auVar83._14_2_ = 0;
              auVar113._4_4_ = iVar34;
              auVar113._0_4_ = iVar34;
              auVar113._8_4_ = iVar34;
              auVar113._12_4_ = iVar34;
              auVar112 = pmaddwd(auVar83,auVar113);
              auVar107._0_4_ = auVar105._0_4_;
              local_138._0_4_ = auVar112._0_4_ + auVar107._0_4_ + auVar115._0_4_;
              local_138._4_4_ = auVar112._4_4_ + auVar105._4_4_ + auVar115._4_4_;
              local_138._8_4_ = auVar112._8_4_ + auVar105._8_4_ + auVar115._8_4_;
              local_138._12_4_ = auVar112._12_4_ + auVar105._12_4_ + auVar115._12_4_;
              auVar110._0_12_ = auVar105._0_12_;
              auVar110._12_2_ = auVar105._6_2_;
              auVar110._14_2_ = auVar117._6_2_ * sVar86;
              auVar109._12_4_ = auVar110._12_4_;
              auVar109._0_10_ = auVar105._0_10_;
              auVar109._10_2_ = auVar117._4_2_ * sVar85;
              auVar108._10_6_ = auVar109._10_6_;
              auVar108._0_8_ = auVar105._0_8_;
              auVar108._8_2_ = auVar105._4_2_;
              auVar107._8_8_ = auVar108._8_8_;
              auVar107._6_2_ = auVar117._2_2_ * sVar84;
              auVar107._4_2_ = auVar105._2_2_;
              Var27 = CONCAT64(CONCAT42(CONCAT22(sVar79,sVar79),sVar78),CONCAT22(sVar78,sVar79));
              auVar22._4_8_ = (long)((unkuint10)Var27 >> 0x10);
              auVar22._2_2_ = sVar77;
              auVar22._0_2_ = sVar77;
              auVar72._0_4_ = (int)sVar69;
              iVar50 = auVar22._0_4_ >> 0x10;
              auVar70._0_8_ = CONCAT44(iVar50,auVar72._0_4_);
              auVar70._8_4_ = (int)((unkuint10)Var27 >> 0x10) >> 0x10;
              local_68._0_4_ =
                   (int)(short)(auVar117._0_2_ * sVar80) + local_68._0_4_ + auVar72._0_4_;
              local_68._4_4_ = (auVar107._4_4_ >> 0x10) + local_68._4_4_ + iVar50;
              local_68._8_4_ = (auVar108._8_4_ >> 0x10) + local_68._8_4_ + auVar70._8_4_;
              local_68._12_4_ = (auVar109._12_4_ >> 0x10) + local_68._12_4_ + (int)sVar79;
              auVar73._12_2_ = sVar77 >> 0xf;
              auVar73._0_12_ = auVar70;
              auVar73._14_2_ = sVar90;
              auVar115._12_4_ = auVar73._12_4_;
              auVar115._0_10_ = auVar70._0_10_;
              auVar115._10_2_ = sVar89;
              auVar117._10_6_ = auVar115._10_6_;
              auVar117._8_2_ = sVar77;
              auVar117._0_8_ = auVar70._0_8_;
              auVar72._8_8_ = auVar117._8_8_;
              auVar72._6_2_ = sVar88;
              auVar72._4_2_ = sVar69 >> 0xf;
              auVar74._0_4_ = (int)sVar87;
              iVar50 = auVar72._4_4_ >> 0x10;
              auVar71._0_8_ = CONCAT44(iVar50,auVar74._0_4_);
              auVar71._8_4_ = auVar117._8_4_ >> 0x10;
              Var27 = CONCAT64(CONCAT42(CONCAT22(sVar97,sVar90),auVar96._4_2_ * sVar85),
                               CONCAT22(sVar89,sVar90));
              auVar23._4_8_ = (long)((unkuint10)Var27 >> 0x10);
              auVar23._2_2_ = auVar96._2_2_ * sVar84;
              auVar23._0_2_ = sVar88;
              local_78._0_4_ = (int)(short)(auVar96._0_2_ * sVar80) + local_78._0_4_ + auVar74._0_4_
              ;
              local_78._4_4_ = (auVar23._0_4_ >> 0x10) + local_78._4_4_ + iVar50;
              local_78._8_4_ =
                   ((int)((unkuint10)Var27 >> 0x10) >> 0x10) + local_78._8_4_ + auVar71._8_4_;
              local_78._12_4_ = (int)sVar97 + local_78._12_4_ + (auVar115._12_4_ >> 0x10);
              auVar96._12_2_ = sVar88 >> 0xf;
              auVar96._0_12_ = auVar71;
              auVar96._14_2_ = sVar95;
              auVar76._12_4_ = auVar96._12_4_;
              auVar76._0_10_ = auVar71._0_10_;
              auVar76._10_2_ = sVar94;
              auVar75._10_6_ = auVar76._10_6_;
              auVar75._8_2_ = sVar88;
              auVar75._0_8_ = auVar71._0_8_;
              auVar74._8_8_ = auVar75._8_8_;
              auVar74._6_2_ = sVar93;
              auVar74._4_2_ = sVar87 >> 0xf;
              Var27 = CONCAT64(CONCAT42(CONCAT22(sVar99,sVar95),auVar82._4_2_ * sVar85),
                               CONCAT22(sVar94,sVar95));
              auVar24._4_8_ = (long)((unkuint10)Var27 >> 0x10);
              auVar24._2_2_ = auVar82._2_2_ * sVar84;
              auVar24._0_2_ = sVar93;
              local_88._0_4_ =
                   (int)(short)(auVar82._0_2_ * sVar80) + local_88._0_4_ +
                   (int)(short)(auVar92._0_2_ * sVar111);
              local_88._4_4_ = (auVar24._0_4_ >> 0x10) + local_88._4_4_ + (auVar74._4_4_ >> 0x10);
              local_88._8_4_ =
                   ((int)((unkuint10)Var27 >> 0x10) >> 0x10) + local_88._8_4_ +
                   (auVar75._8_4_ >> 0x10);
              local_88._12_4_ = (int)sVar99 + local_88._12_4_ + (auVar76._12_4_ >> 0x10);
              pcVar65 = pcVar65 + 8;
              puVar57 = puVar57 + 1;
              iVar35 = iVar35 + 2;
              auVar105 = local_138;
              uVar37 = uVar33 & 0xfffffffe;
            } while (iVar35 < (int)uVar33);
          }
          if ((int)uVar37 < (int)uVar33) {
            do {
              lVar54 = 0;
              do {
                iVar35 = (int)*(char *)((long)puVar57 + lVar54);
                *(int *)(local_138 + lVar54 * 4) =
                     *(int *)(local_138 + lVar54 * 4) + *pcVar65 * iVar35;
                *(int *)(local_68 + lVar54 * 4) =
                     *(int *)(local_68 + lVar54 * 4) + pcVar65[1] * iVar35;
                *(int *)(local_78 + lVar54 * 4) =
                     *(int *)(local_78 + lVar54 * 4) + pcVar65[2] * iVar35;
                *(int *)(local_88 + lVar54 * 4) =
                     *(int *)(local_88 + lVar54 * 4) + pcVar65[3] * iVar35;
                lVar54 = lVar54 + 1;
              } while (lVar54 != 4);
              pcVar65 = pcVar65 + 4;
              puVar57 = (ulong *)((long)puVar57 + 4);
              uVar37 = uVar37 + 1;
            } while (uVar37 != uVar33);
          }
          lVar54 = 0;
          do {
            *(float *)((long)pfVar46 + lVar54) =
                 (float)*(int *)(local_138 + lVar54) * fVar1 + fVar81;
            *(float *)((long)pfVar32 + lVar54) = (float)*(int *)(local_68 + lVar54) * fVar2 + fVar98
            ;
            *(float *)((long)pfVar40 + lVar54) = (float)*(int *)(local_78 + lVar54) * fVar3 + fVar91
            ;
            *(float *)((long)pfVar52 + lVar54) =
                 (float)*(int *)(local_88 + lVar54) * fVar4 + fVar100;
            lVar54 = lVar54 + 4;
          } while (lVar54 != 0x10);
          pfVar46 = pfVar46 + 4;
          pfVar32 = pfVar32 + 4;
          pfVar40 = pfVar40 + 4;
          pfVar52 = pfVar52 + 4;
          uVar62 = uVar42 + 4;
          uVar60 = uVar42 + 7;
          uVar42 = uVar62;
          local_f0 = fVar2;
          local_ec = fVar1;
        } while (uVar60 < uVar28);
      }
      if ((int)uVar62 < (int)uVar28) {
        pcVar44 = (char *)(uVar30 * local_100 + (long)local_188);
        do {
          pcVar66 = (char *)((ulong)(((uint)uVar62 & 3) + ((uint)(uVar62 >> 2) & 0x3fffffff)) *
                             local_b0 * local_d8 + local_e8._0_8_);
          iVar35 = 0;
          pcVar65 = pcVar44;
          if ((int)uVar33 < 2) {
            iVar34 = 0;
            iVar48 = 0;
            iVar50 = 0;
            uVar37 = 0;
          }
          else {
            iVar50 = 0;
            iVar61 = 1;
            iVar48 = 0;
            iVar34 = 0;
            iVar35 = 0;
            do {
              iVar45 = (int)*pcVar66;
              iVar67 = (int)pcVar66[1];
              iVar35 = pcVar65[1] * iVar67 + *pcVar65 * iVar45 + iVar35;
              iVar34 = pcVar65[3] * iVar67 + pcVar65[2] * iVar45 + iVar34;
              iVar48 = pcVar65[5] * iVar67 + pcVar65[4] * iVar45 + iVar48;
              iVar50 = pcVar65[7] * iVar67 + pcVar65[6] * iVar45 + iVar50;
              pcVar65 = pcVar65 + 8;
              pcVar66 = pcVar66 + 2;
              iVar61 = iVar61 + 2;
              uVar37 = uVar33 & 0xfffffffe;
            } while (iVar61 < (int)uVar33);
          }
          if ((int)uVar37 < (int)uVar33) {
            lVar54 = 0;
            do {
              iVar61 = (int)pcVar66[lVar54];
              iVar35 = iVar35 + pcVar65[lVar54 * 4] * iVar61;
              iVar34 = iVar34 + pcVar65[lVar54 * 4 + 1] * iVar61;
              iVar48 = iVar48 + pcVar65[lVar54 * 4 + 2] * iVar61;
              iVar50 = iVar50 + pcVar65[lVar54 * 4 + 3] * iVar61;
              lVar54 = lVar54 + 1;
            } while (uVar33 - uVar37 != (int)lVar54);
          }
          *pfVar46 = (float)iVar35 * fVar1 + fVar81;
          *pfVar32 = (float)iVar34 * fVar2 + fVar98;
          *pfVar40 = (float)iVar48 * fVar3 + fVar91;
          *pfVar52 = (float)iVar50 * fVar4 + fVar100;
          pfVar46 = pfVar46 + 1;
          pfVar32 = pfVar32 + 1;
          pfVar40 = pfVar40 + 1;
          pfVar52 = pfVar52 + 1;
          uVar37 = (uint)uVar62 + 1;
          uVar62 = (ulong)uVar37;
        } while (uVar37 != uVar28);
      }
      uVar42 = local_100 + 1;
    } while (local_100 + 1 != local_90);
  }
  if (iVar41 != iVar29) {
    pvVar59 = local_a0->data;
    sVar5 = local_a0->cstep;
    sVar6 = local_a0->elemsize;
    pfVar7 = (scale_dequant->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar54 = (long)iVar41;
    do {
      if (_bias == (Mat *)0x0) {
        fVar81 = 0.0;
      }
      else {
        fVar81 = *(float *)((long)&_bias->data + lVar54 * 4);
      }
      pfVar32 = (float *)(sVar5 * sVar6 * lVar54 + (long)pvVar59);
      uVar42 = 0;
      fVar98 = pfVar7[lVar54];
      uVar37 = (uint)lVar54;
      if (3 < (int)uVar28) {
        uVar51 = uVar37 + 3;
        if (-1 < (int)uVar37) {
          uVar51 = uVar37;
        }
        pcVar44 = (char *)((long)(int)(((int)uVar51 >> 2) + (uVar37 - (uVar51 & 0xfffffffc))) *
                           uVar30 + (long)local_188);
        uVar62 = 0;
        do {
          puVar57 = (ulong *)((uVar62 >> 2) * local_b0 * local_d8 + local_e8._0_8_);
          local_138 = (undefined1  [16])0x0;
          pcVar65 = pcVar44;
          uVar51 = 0;
          if (1 < (int)uVar33) {
            iVar41 = 1;
            local_138._0_4_ = 0;
            local_138._4_4_ = 0;
            local_138._8_4_ = 0;
            local_138._12_4_ = 0;
            do {
              iVar35 = (int)pcVar65[1];
              iVar29 = (int)*pcVar65;
              auVar101._4_4_ = iVar29;
              auVar101._0_4_ = iVar29;
              auVar101._8_4_ = iVar29;
              auVar101._12_4_ = iVar29;
              auVar102._4_4_ = iVar35;
              auVar102._0_4_ = iVar35;
              auVar102._8_4_ = iVar35;
              auVar102._12_4_ = iVar35;
              auVar103._8_8_ = 0;
              auVar103._0_8_ = *puVar57;
              auVar105 = psllw(auVar103,8);
              auVar105 = psraw(auVar105,8);
              auVar10._10_2_ = 0;
              auVar10._0_10_ = auVar105._0_10_;
              auVar10._12_2_ = auVar105._6_2_;
              auVar14._8_2_ = auVar105._4_2_;
              auVar14._0_8_ = auVar105._0_8_;
              auVar14._10_4_ = auVar10._10_4_;
              auVar25._6_8_ = 0;
              auVar25._0_6_ = auVar14._8_6_;
              auVar18._4_2_ = auVar105._2_2_;
              auVar18._0_4_ = auVar105._0_4_;
              auVar18._6_8_ = SUB148(auVar25 << 0x40,6);
              auVar106._0_4_ = auVar105._0_4_ & 0xffff;
              auVar106._4_10_ = auVar18._4_10_;
              auVar106._14_2_ = 0;
              auVar112 = pmaddwd(auVar106,auVar101);
              auVar105 = psraw(auVar103,8);
              auVar11._10_2_ = 0;
              auVar11._0_10_ = auVar105._0_10_;
              auVar11._12_2_ = auVar105._6_2_;
              auVar15._8_2_ = auVar105._4_2_;
              auVar15._0_8_ = auVar105._0_8_;
              auVar15._10_4_ = auVar11._10_4_;
              auVar26._6_8_ = 0;
              auVar26._0_6_ = auVar15._8_6_;
              auVar19._4_2_ = auVar105._2_2_;
              auVar19._0_4_ = auVar105._0_4_;
              auVar19._6_8_ = SUB148(auVar26 << 0x40,6);
              auVar104._0_4_ = auVar105._0_4_ & 0xffff;
              auVar104._4_10_ = auVar19._4_10_;
              auVar104._14_2_ = 0;
              auVar105 = pmaddwd(auVar104,auVar102);
              local_138._0_4_ = auVar105._0_4_ + local_138._0_4_ + auVar112._0_4_;
              local_138._4_4_ = auVar105._4_4_ + local_138._4_4_ + auVar112._4_4_;
              local_138._8_4_ = auVar105._8_4_ + local_138._8_4_ + auVar112._8_4_;
              local_138._12_4_ = auVar105._12_4_ + local_138._12_4_ + auVar112._12_4_;
              pcVar65 = pcVar65 + 2;
              puVar57 = puVar57 + 1;
              iVar41 = iVar41 + 2;
              uVar51 = uVar33 & 0xfffffffe;
            } while (iVar41 < (int)uVar33);
          }
          if ((int)uVar51 < (int)uVar33) {
            do {
              lVar53 = 0;
              do {
                *(int *)(local_138 + lVar53 * 4) =
                     *(int *)(local_138 + lVar53 * 4) +
                     (int)*(char *)((long)puVar57 + lVar53) * (int)*pcVar65;
                lVar53 = lVar53 + 1;
              } while (lVar53 != 4);
              pcVar65 = pcVar65 + 1;
              puVar57 = (ulong *)((long)puVar57 + 4);
              uVar51 = uVar51 + 1;
            } while (uVar51 != uVar33);
          }
          *pfVar32 = (float)(int)local_138._0_4_ * fVar98 + fVar81;
          pfVar32[1] = (float)(int)local_138._4_4_ * fVar98 + fVar81;
          pfVar32[2] = (float)(int)local_138._8_4_ * fVar98 + fVar81;
          pfVar32[3] = (float)(int)local_138._12_4_ * fVar98 + fVar81;
          pfVar32 = pfVar32 + 4;
          uVar42 = uVar62 + 4;
          uVar60 = uVar62 + 7;
          uVar62 = uVar42;
        } while (uVar60 < uVar28);
      }
      if ((int)uVar42 < (int)uVar28) {
        uVar51 = uVar37 + 3;
        if (-1 < (int)uVar37) {
          uVar51 = uVar37;
        }
        do {
          if ((int)uVar33 < 1) {
            fVar91 = 0.0;
          }
          else {
            lVar53 = 0;
            iVar41 = 0;
            do {
              iVar41 = iVar41 + (int)*(char *)(local_e8._0_8_ +
                                              lVar53 + (ulong)(((uint)uVar42 & 3) +
                                                              ((uint)(uVar42 >> 2) & 0x3fffffff)) *
                                                       local_b0 * local_d8) *
                                (int)*(char *)((long)local_188 +
                                              lVar53 + (long)(int)(((int)uVar51 >> 2) +
                                                                  (uVar37 - (uVar51 & 0xfffffffc)))
                                                       * uVar30);
              lVar53 = lVar53 + 1;
            } while (uVar33 != (uint)lVar53);
            fVar91 = (float)iVar41;
          }
          *pfVar32 = fVar91 * fVar98 + fVar81;
          pfVar32 = pfVar32 + 1;
          uVar63 = (uint)uVar42 + 1;
          uVar42 = (ulong)uVar63;
        } while (uVar63 != uVar28);
      }
      lVar54 = lVar54 + 1;
    } while (lVar54 < (long)local_120);
  }
  if (local_a8 != (int *)0x0) {
    LOCK();
    *local_a8 = *local_a8 + -1;
    UNLOCK();
    if (*local_a8 == 0) {
      if (local_58 == (Allocator *)0x0) {
        if (local_188 != (void *)0x0) {
          free(local_188);
        }
      }
      else {
        (**(code **)(*(long *)local_58 + 0x18))(local_58,local_188);
      }
    }
  }
  if ((int *)local_e8._8_8_ != (int *)0x0) {
    LOCK();
    *(int *)local_e8._8_8_ = *(int *)local_e8._8_8_ + -1;
    UNLOCK();
    if (*(int *)local_e8._8_8_ == 0) {
      if (local_c8 == (Allocator *)0x0) {
        if ((void *)local_e8._0_8_ != (void *)0x0) {
          free((void *)local_e8._0_8_);
        }
      }
      else {
        (**(code **)(*(long *)local_c8 + 0x18))();
      }
    }
  }
  if (local_110 != (int *)0x0) {
    LOCK();
    *local_110 = *local_110 + -1;
    UNLOCK();
    if (*local_110 == 0) {
      if (local_108 == (Allocator *)0x0) {
        if (__ptr != (void *)0x0) {
          free(__ptr);
        }
      }
      else {
        (**(code **)(*(long *)local_108 + 0x18))(local_108,__ptr);
      }
    }
  }
  return;
}

Assistant:

static void conv_im2col_sgemm_int8_dequant_sse(const Mat &bottom_blob, Mat &top_blob, const Mat &_kernel, \
            const int kernel_w, const int kernel_h, const int stride_w, const int stride_h, const Mat &_bias, std::vector<float> scale_dequant, const Option& opt)
{
    int w = bottom_blob.w;
    int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const signed char *kernel = _kernel;
    const float* bias = _bias;

    // im2row
    Mat bottom_im2row(kernel_h*kernel_w*inch, outw*outh, 1UL, opt.workspace_allocator);
    {
        signed char* ret = (signed char*)bottom_im2row;
        int retID = 0;
    
        for (int i=0; i<outh; i++)
        {
            for (int j=0; j<outw; j++)
            {
                for (int p=0; p<inch; p++)
                {
                    const signed char* input = bottom_blob.channel(p);
                    for (int u=0; u<kernel_h; u++)
                    {
                        for (int v=0; v<kernel_w; v++)
                        {    
                            int row = u + i * stride_h;
                            int col = v + j * stride_w;
                            int index = row * w + col;
                            ret[retID] = input[index];
                            retID++;
                        }
                    }                
                }
            }
        }
    }    

    int kernel_size = kernel_w * kernel_h;
    int out_size = outw * outh;

    // int M = outch;  // outch
    int N = outw * outh; // outsize or out stride
    int K = kernel_w * kernel_h * inch; // ksize * inch

    // bottom_im2row memory packed 4 x 4
    Mat bottom_tm(4*kernel_size, inch, out_size/4 + out_size%4, (size_t)1u, opt.workspace_allocator);
    {
        int nn_size = out_size >> 2;
        int remain_size_start = nn_size << 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii=0; ii<nn_size; ii++)
        {
            int i = ii * 4;

            const signed char* img0 = bottom_im2row.row<signed char>(i);
            const signed char* img1 = bottom_im2row.row<signed char>(i+1);
            const signed char* img2 = bottom_im2row.row<signed char>(i+2);
            const signed char* img3 = bottom_im2row.row<signed char>(i+3);

            signed char* tmpptr = bottom_tm.channel(i/4);

            int q = 0;
            for (; q+1<inch*kernel_size; q=q+2)
            {
                tmpptr[0] = img0[0];
                tmpptr[1] = img0[1];
                tmpptr[2] = img1[0];
                tmpptr[3] = img1[1];
                tmpptr[4] = img2[0];
                tmpptr[5] = img2[1];
                tmpptr[6] = img3[0];
                tmpptr[7] = img3[1];

                tmpptr += 8;
                img0 += 2;
                img1 += 2;
                img2 += 2;
                img3 += 2;
            }

            for (; q<inch*kernel_size; q++)
            {
                tmpptr[0] = img0[0];
                tmpptr[1] = img1[0];
                tmpptr[2] = img2[0];
                tmpptr[3] = img3[0];

                tmpptr += 4;
                img0 += 1;
                img1 += 1;
                img2 += 1;
                img3 += 1;                
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i=remain_size_start; i<out_size; i++)
        {
            const signed char* img0 = bottom_im2row.row<signed char>(i);

            signed char* tmpptr = bottom_tm.channel(i/4 + i%4);

            int q=0;
            for (; q+1<inch*kernel_size; q=q+2)
            {
                tmpptr[0] = img0[0];
                tmpptr[1] = img0[1];

                tmpptr += 2;
                img0 += 2;
            }

            for (; q<inch*kernel_size; q++)
            {
                tmpptr[0] = img0[0];

                tmpptr += 1;
                img0 += 1;
            }
        }       
    }

    // kernel memory packed 4 x 4
    Mat kernel_tm(4*kernel_size, inch, outch/4 + outch%4, (size_t)1u, opt.workspace_allocator);
    {
        int nn_outch = 0;
        int remain_outch_start = 0;

        nn_outch = outch >> 2;
        remain_outch_start = nn_outch << 2;
        
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp=0; pp<nn_outch; pp++)
        {
            int p = pp * 4;

            const signed char* k0 = kernel + (p+0)*inch*kernel_size;
            const signed char* k1 = kernel + (p+1)*inch*kernel_size;
            const signed char* k2 = kernel + (p+2)*inch*kernel_size;
            const signed char* k3 = kernel + (p+3)*inch*kernel_size;

            signed char* ktmp = kernel_tm.channel(p/4);

            int q=0;
            for (; q+1<inch*kernel_size; q+=2)
            {
                ktmp[0] = k0[0];
                ktmp[1] = k0[1];
                ktmp[2] = k1[0];
                ktmp[3] = k1[1];
                ktmp[4] = k2[0];
                ktmp[5] = k2[1];
                ktmp[6] = k3[0];
                ktmp[7] = k3[1];

                ktmp += 8;

                k0 += 2;
                k1 += 2;
                k2 += 2;
                k3 += 2;
            }

            for (; q<inch*kernel_size; q++)
            { 
                ktmp[0] = k0[0];
                ktmp[1] = k1[0];
                ktmp[2] = k2[0];
                ktmp[3] = k3[0];
                ktmp += 4;

                k0 += 1;
                k1 += 1;
                k2 += 1;
                k3 += 1;
            }           
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p=remain_outch_start; p<outch; p++)
        {
            const signed char* k0 = kernel + (p+0)*inch*kernel_size;

            signed char* ktmp = kernel_tm.channel(p/4 + p%4);

            int q=0;
            for (; q+1<inch*kernel_size; q=q+2)
            {
                ktmp[0] = k0[0];
                ktmp[1] = k0[1];
                ktmp += 2;
                k0 += 2;
            }

            for (; q<inch*kernel_size; q++)
            {
                ktmp[0] = k0[0];
                ktmp++;
                k0++;
            }
        }
    }    

    // 4x4
    // sgemm(int M, int N, int K, float* A, float* B, float* C)
    {
        // int M = outch;  // outch
        // int N = outw * outh; // outsize or out stride
        // int L = kernel_w * kernel_h * inch; // ksize * inch

        int nn_outch = 0;
        int remain_outch_start = 0;

        nn_outch = outch >> 2;
        remain_outch_start = nn_outch << 2;
        
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp=0; pp<nn_outch; pp++)
        {
            int i = pp * 4;

            const float bias0 = bias ? bias[i] : 0.f;
            const float bias1 = bias ? bias[i+1] : 0.f;
            const float bias2 = bias ? bias[i+2] : 0.f;
            const float bias3 = bias ? bias[i+3] : 0.f;

            const float scale_dequant0 = scale_dequant[i];
            const float scale_dequant1 = scale_dequant[i+1];
            const float scale_dequant2 = scale_dequant[i+2];
            const float scale_dequant3 = scale_dequant[i+3];

            float* output0 = top_blob.channel(i);
            float* output1 = top_blob.channel(i+1);
            float* output2 = top_blob.channel(i+2);
            float* output3 = top_blob.channel(i+3);

            int j=0;
            for (; j+3<N; j=j+4)
            {
                signed char* vb = bottom_tm.channel(j/4);
                signed char* va = kernel_tm.channel(i/4);
                
                int sum0[4] = {0};
                int sum1[4] = {0};
                int sum2[4] = {0};
                int sum3[4] = {0};
               
                int k=0;

                for (; k+1<K; k=k+2)
                {
                    for (int n=0; n<4; n++)
                    {
                        sum0[n] += (int)va[0] * vb[2*n];   // k0
                        sum0[n] += (int)va[1] * vb[2*n+1];

                        sum1[n] += (int)va[2] * vb[2*n];   // k1
                        sum1[n] += (int)va[3] * vb[2*n+1];

                        sum2[n] += (int)va[4] * vb[2*n];   // k2
                        sum2[n] += (int)va[5] * vb[2*n+1];

                        sum3[n] += (int)va[6] * vb[2*n];   // k3
                        sum3[n] += (int)va[7] * vb[2*n+1];
                    }

                    va += 8;
                    vb += 8;
                }

                for (; k<K; k++)
                {
                    for (int n=0; n<4; n++)
                    {
                        sum0[n] += (int)va[0] * vb[n];
                        sum1[n] += (int)va[1] * vb[n];
                        sum2[n] += (int)va[2] * vb[n];
                        sum3[n] += (int)va[3] * vb[n];
                    }
                    
                    va += 4;
                    vb += 4;
                }

                for (int n=0; n<4; n++)
                {
                    output0[n] = (float)sum0[n] * scale_dequant0 + bias0;
                    output1[n] = (float)sum1[n] * scale_dequant1 + bias1;
                    output2[n] = (float)sum2[n] * scale_dequant2 + bias2;
                    output3[n] = (float)sum3[n] * scale_dequant3 + bias3;
                }
                output0 += 4;
                output1 += 4;
                output2 += 4;
                output3 += 4;
            }

            for (; j<N; j++)
            {                
                int sum0 = 0;
                int sum1 = 0;
                int sum2 = 0;
                int sum3 = 0;

                signed char* vb = bottom_tm.channel(j/4 + j%4);
                signed char* va = kernel_tm.channel(i/4);

                int k=0;

                for (; k+1<K; k=k+2)
                {
                    sum0 += (int)va[0] * vb[0];
                    sum0 += (int)va[1] * vb[1];

                    sum1 += (int)va[2] * vb[0];
                    sum1 += (int)va[3] * vb[1];

                    sum2 += (int)va[4] * vb[0];
                    sum2 += (int)va[5] * vb[1];

                    sum3 += (int)va[6] * vb[0];
                    sum3 += (int)va[7] * vb[1];

                    va += 8;
                    vb += 2;
                }

                for (; k<K; k++)
                {
                    sum0 += (int)va[0] * vb[0];
                    sum1 += (int)va[1] * vb[0];
                    sum2 += (int)va[2] * vb[0];
                    sum3 += (int)va[3] * vb[0];

                    va += 4;
                    vb += 1;
                }
                
                output0[0] = (float)sum0 * scale_dequant0 + bias0;
                output1[0] = (float)sum1 * scale_dequant1 + bias1;
                output2[0] = (float)sum2 * scale_dequant2 + bias2;
                output3[0] = (float)sum3 * scale_dequant3 + bias3;

                output0++;
                output1++;
                output2++;
                output3++;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i=remain_outch_start; i<outch; i++)
        {
            float* output = top_blob.channel(i);

            const float bias0 = bias ? bias[i] : 0.f;
            const float scale_dequant0 = scale_dequant[i];            

            int j=0;
            for (; j+3<N; j=j+4)
            {
                signed char* vb = bottom_tm.channel(j/4);
                signed char* va = kernel_tm.channel(i/4 + i%4);
                int sum[4] = {0};

                int k=0;
                for (; k+1<K; k=k+2)
                {
                    for (int n=0; n<4; n++)
                    {
                        sum[n] += (int)va[0] * vb[2*n];
                        sum[n] += (int)va[1] * vb[2*n+1];
                    }
                    va += 2;
                    vb += 8;
                }

                for (; k<K; k++)
                {
                    for (int n=0; n<4; n++)
                    {
                        sum[n] += (int)va[0] * vb[n];
                    }
                    va += 1;
                    vb += 4;
                }

                for (int n=0; n<4; n++)
                {
                    output[n] = (float)sum[n] * scale_dequant0 + bias0;
                }
                output += 4;
            }

            for (; j<N; j++)
            {
                int sum = 0;

                signed char* vb = bottom_tm.channel(j/4 + j%4);
                signed char* va = kernel_tm.channel(i/4 + i%4);

                for (int k=0; k<K; k++)
                {
                    sum += (int)va[0] * vb[0];

                    va += 1;
                    vb += 1;
                }
                output[0] = (float)sum * scale_dequant0 + bias0;

                output++;
            }
        }
    }

    // // sgemm(int M, int N, int K, float* A, float* B, float* C)
    // {
    //     for (int i=0; i<M; i++)
    //     {
    //         int* output = top_blob.channel(i);

    //         for (int j=0; j<N; j++)
    //         {
    //             int sum = 0;

    //             signed char* vb = (signed char*)bottom_im2row + K * j;
    //             const signed char* va = kernel + K * i;

    //             for (int k=0; k<K; k++)
    //             {
    //                 sum += (int)va[0] * vb[0];

    //                 va += 1;
    //                 vb += 1;
    //             }
    //             output[0] = sum;

    //             output++;
    //         }
    //     }
    // }
}